

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result_reporter.hpp
# Opt level: O0

void iutest::detail::DefaultGlobalTestPartResultReporter::DefaultReportTestPartResult
               (TestPartResult *test_part_result)

{
  undefined8 uVar1;
  TestEventListeners *this;
  string local_38;
  TestResult *local_18;
  TestResult *result;
  TestPartResult *test_part_result_local;
  
  result = (TestResult *)test_part_result;
  local_18 = UnitTestImpl::current_test_result();
  if (local_18 == (TestResult *)0x0) {
    iuCodeMessage::make_newline_message_abi_cxx11_(&local_38,(iuCodeMessage *)result);
    uVar1 = std::__cxx11::string::c_str();
    iuConsole::output("%s",uVar1);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    TestResult::AddTestPartResult(local_18,(TestPartResult *)result);
  }
  this = TestEnv::event_listeners();
  TestEventListeners::OnTestPartResult(this,(TestPartResult *)result);
  return;
}

Assistant:

static void DefaultReportTestPartResult(const TestPartResult& test_part_result)
    {
        TestResult* result = UnitTestImpl::current_test_result();
        if( result )
        {
            result->AddTestPartResult(test_part_result);
        }
        else
        {
            iuConsole::output("%s", test_part_result.make_newline_message().c_str());
        }
        TestEnv::event_listeners().OnTestPartResult(test_part_result);
    }